

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O1

void __thiscall CGL::OSDText::~OSDText(OSDText *this)

{
  if (this->ft != (FT_Library *)0x0) {
    operator_delete(this->ft,8);
  }
  if (this->font != (char *)0x0) {
    operator_delete(this->font,1);
  }
  if (this->face != (FT_Face_conflict *)0x0) {
    operator_delete(this->face,8);
  }
  std::vector<CGL::OSDLine,_std::allocator<CGL::OSDLine>_>::_M_erase_at_end
            (&this->lines,
             (this->lines).super__Vector_base<CGL::OSDLine,_std::allocator<CGL::OSDLine>_>._M_impl.
             super__Vector_impl_data._M_start);
  (*__glewDeleteProgram)(this->program);
  std::vector<CGL::OSDLine,_std::allocator<CGL::OSDLine>_>::~vector(&this->lines);
  return;
}

Assistant:

OSDText::~OSDText() {

  delete ft;
  delete font;
  delete face;

  lines.clear();

  glDeleteProgram(program);
}